

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatrix33.h
# Opt level: O2

void __thiscall
chrono::ChMatrix33<double>::Set_A_Cardano(ChMatrix33<double> *this,ChVector<double> *angles)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar7 [64];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 extraout_var [56];
  
  dVar2 = cos(angles->m_data[0]);
  dVar3 = cos(angles->m_data[1]);
  dVar4 = cos(angles->m_data[2]);
  dVar5 = sin(angles->m_data[0]);
  dVar6 = sin(angles->m_data[1]);
  auVar7._0_8_ = sin(angles->m_data[2]);
  auVar7._8_56_ = extraout_var;
  auVar1._8_8_ = extraout_XMM0_Qb;
  auVar1._0_8_ = dVar5;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar4;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar2;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar6 * dVar5 * auVar7._0_8_;
  auVar8 = vfmsub231sd_fma(auVar10,auVar12,auVar13);
  (this->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       auVar8._0_8_;
  (this->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       dVar3 * -dVar5;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar4 * dVar6 * dVar5;
  auVar8 = vfmadd231sd_fma(auVar8,auVar12,auVar7._0_16_);
  (this->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       auVar8._0_8_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar6 * dVar2 * auVar7._0_8_;
  auVar8 = vfmadd231sd_fma(auVar11,auVar1,auVar13);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar4 * dVar6 * dVar2;
  auVar1 = vfmsub231sd_fma(auVar9,auVar1,auVar7._0_16_);
  (this->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       auVar8._0_8_;
  (this->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       dVar2 * dVar3;
  (this->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       auVar1._0_8_;
  (this->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       dVar3 * -auVar7._0_8_;
  (this->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] = dVar6;
  (this->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       dVar3 * dVar4;
  return;
}

Assistant:

inline void ChMatrix33<Real>::Set_A_Cardano(const ChVector<Real>& angles) {
    Real cx = std::cos(angles.x());
    Real cy = std::cos(angles.y());
    Real cz = std::cos(angles.z());
    Real sx = std::sin(angles.x());
    Real sy = std::sin(angles.y());
    Real sz = std::sin(angles.z());

    (*this)(0, 0) = (cx * cz) - (sz * sx * sy);
    (*this)(0, 1) = -sx * cy;
    (*this)(0, 2) = (cx * sz) + (sx * sy * cz);
    (*this)(1, 0) = (sx * cz) + (cx * sy * sz);
    (*this)(1, 1) = cy * cx;
    (*this)(1, 2) = (sx * sz) - (cx * sy * cz);
    (*this)(2, 0) = -sz * cy;
    (*this)(2, 1) = sy;
    (*this)(2, 2) = cy * cz;
}